

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-tls.c
# Opt level: O2

void lws_context_deinit_ssl_library(lws_context *context)

{
  return;
}

Assistant:

void
lws_context_deinit_ssl_library(struct lws_context *context)
{
#if LWS_MAX_SMP != 1
	int n;

	if (!lws_check_opt(context->options,
			   LWS_SERVER_OPTION_DO_SSL_GLOBAL_INIT))
		return;

	CRYPTO_set_locking_callback(NULL);

	if (openssl_mutexes) {
		for (n = 0; n < CRYPTO_num_locks(); n++)
			pthread_mutex_destroy(&openssl_mutexes[n]);

		OPENSSL_free(openssl_mutexes);
		openssl_mutexes = NULL;
	}
#endif
}